

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::split
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,string *s,char delim)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  undefined1 local_1e0 [8];
  string item;
  stringstream local_1b0 [8];
  stringstream ss;
  char delim_local;
  string *s_local;
  uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b0,(string *)s,_Var2);
  std::__cxx11::string::string((string *)local_1e0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)local_1e0,delim);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_1e0);
  }
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

vector<string> split(const string &s, char delim) {
      vector<string> result;
      stringstream ss(s);
      string item;

      while (getline(ss, item, delim)) {
        result.push_back(item);
      }

      return result;
    }